

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Catch::XmlReporter::testRunEnded(XmlReporter *this,TestRunStats *testRunStats)

{
  XmlWriter *this_00;
  string local_b8;
  string local_98;
  string local_78;
  string local_58;
  ScopedElement local_38;
  ScopedElement scoped;
  
  StreamingReporterBase::testRunEnded(&this->super_StreamingReporterBase,testRunStats);
  this_00 = &this->m_xml;
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"OverallResults","");
  local_38.m_writer = this_00;
  XmlWriter::startElement(this_00,&local_b8);
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"successes","");
  XmlWriter::writeAttribute<unsigned_long>
            (local_38.m_writer,&local_58,(unsigned_long *)&testRunStats->totals);
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"failures","");
  XmlWriter::writeAttribute<unsigned_long>
            (local_38.m_writer,&local_98,&(testRunStats->totals).assertions.failed);
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"expectedFailures","");
  XmlWriter::writeAttribute<unsigned_long>
            (local_38.m_writer,&local_78,&(testRunStats->totals).assertions.failedButOk);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  XmlWriter::ScopedElement::~ScopedElement(&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  XmlWriter::endElement(this_00);
  return;
}

Assistant:

virtual void testRunEnded(TestRunStats const& testRunStats) CATCH_OVERRIDE {
			StreamingReporterBase::testRunEnded(testRunStats);
			m_xml.scopedElement("OverallResults")
				.writeAttribute("successes", testRunStats.totals.assertions.passed)
				.writeAttribute("failures", testRunStats.totals.assertions.failed)
				.writeAttribute("expectedFailures", testRunStats.totals.assertions.failedButOk);
			m_xml.endElement();
		}